

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cxx::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cxx *this,FieldDescriptor *field)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  CppType CVar4;
  int32 iVar5;
  uint uVar6;
  uint32 uVar7;
  int value_00;
  int64 iVar8;
  protobuf *ppVar9;
  long lVar10;
  char *__s;
  EnumDescriptor *this_00;
  EnumValueDescriptor *this_01;
  string *src;
  LogMessage *other;
  int i;
  uint i_00;
  FieldDescriptor *field_00;
  long i_01;
  unsigned_long i_02;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  SubstituteArg *in_stack_fffffffffffffb68;
  allocator<char> local_3aa;
  LogFinisher local_3a9;
  LogMessage local_3a8;
  string local_370;
  string local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  SubstituteArg local_2f0;
  SubstituteArg local_2c0;
  SubstituteArg local_290;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  string local_140;
  SubstituteArg local_120;
  allocator<char> local_ed;
  undefined1 local_ec;
  allocator<char> local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  float local_e8;
  allocator<char> local_e3;
  allocator<char> local_e2;
  allocator<char> local_e1;
  float value_1;
  double value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_51;
  string local_50;
  allocator<char> local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  string *float_value;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  bVar3 = false;
  switch(CVar4) {
  case CPPTYPE_INT32:
    iVar5 = FieldDescriptor::default_value_int32(local_18);
    if (iVar5 == -0x80000000) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"-0x80000000",&local_19);
      std::allocator<char>::~allocator(&local_19);
    }
    else {
      uVar6 = FieldDescriptor::default_value_int32(local_18);
      SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar6,i);
    }
    break;
  case CPPTYPE_INT64:
    iVar8 = FieldDescriptor::default_value_int64(local_18);
    if (iVar8 == -0x8000000000000000) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"GOOGLE_LONGLONG(-0x8000000000000000)",&local_51);
      std::allocator<char>::~allocator(&local_51);
    }
    else {
      ppVar9 = (protobuf *)FieldDescriptor::default_value_int64(local_18);
      SimpleItoa_abi_cxx11_(&local_98,ppVar9,i_01);
      std::operator+(&local_78,"GOOGLE_LONGLONG(",&local_98);
      std::operator+(__return_storage_ptr__,&local_78,")");
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    break;
  case CPPTYPE_UINT32:
    uVar7 = FieldDescriptor::default_value_uint32(local_18);
    SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)uVar7,i_00);
    std::operator+(__return_storage_ptr__,&local_50,"u");
    std::__cxx11::string::~string((string *)&local_50);
    break;
  case CPPTYPE_UINT64:
    ppVar9 = (protobuf *)FieldDescriptor::default_value_uint64(local_18);
    SimpleItoa_abi_cxx11_((string *)&value,ppVar9,i_02);
    std::operator+(&local_b8,"GOOGLE_ULONGLONG(",(string *)&value);
    std::operator+(__return_storage_ptr__,&local_b8,")");
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&value);
    break;
  case CPPTYPE_DOUBLE:
    dVar13 = FieldDescriptor::default_value_double(local_18);
    _value_1 = dVar13;
    dVar14 = std::numeric_limits<double>::infinity();
    dVar2 = _value_1;
    if ((dVar13 != dVar14) || (NAN(dVar13) || NAN(dVar14))) {
      dVar13 = std::numeric_limits<double>::infinity();
      if ((dVar2 != -dVar13) || (NAN(dVar2) || NAN(-dVar13))) {
        if (NAN(_value_1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"::google::protobuf::internal::NaN()",
                     &local_e3);
          std::allocator<char>::~allocator(&local_e3);
        }
        else {
          SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,_value_1);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"-::google::protobuf::internal::Infinity()",
                   &local_e2);
        std::allocator<char>::~allocator(&local_e2);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"::google::protobuf::internal::Infinity()",
                 &local_e1);
      std::allocator<char>::~allocator(&local_e1);
    }
    break;
  case CPPTYPE_FLOAT:
    fVar11 = FieldDescriptor::default_value_float(local_18);
    local_e8 = fVar11;
    fVar12 = std::numeric_limits<float>::infinity();
    fVar1 = local_e8;
    if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
      fVar11 = std::numeric_limits<float>::infinity();
      if ((fVar1 != -fVar11) || (NAN(fVar1) || NAN(-fVar11))) {
        if (NAN(local_e8)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,
                     "static_cast<float>(::google::protobuf::internal::NaN())",&local_eb);
          std::allocator<char>::~allocator(&local_eb);
        }
        else {
          local_ec = 0;
          SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,local_e8);
          lVar10 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x387634);
          if (lVar10 != -1) {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,
                   "static_cast<float>(-::google::protobuf::internal::Infinity())",&local_ea);
        std::allocator<char>::~allocator(&local_ea);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "static_cast<float>(::google::protobuf::internal::Infinity())",&local_e9);
      std::allocator<char>::~allocator(&local_e9);
    }
    break;
  case CPPTYPE_BOOL:
    bVar3 = FieldDescriptor::default_value_bool(local_18);
    __s = "false";
    if (bVar3) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_ed);
    std::allocator<char>::~allocator(&local_ed);
    break;
  case CPPTYPE_ENUM:
    this_00 = FieldDescriptor::enum_type(local_18);
    ClassName_abi_cxx11_(&local_140,(cxx *)this_00,(EnumDescriptor *)0x1,bVar3);
    strings::internal::SubstituteArg::SubstituteArg(&local_120,&local_140);
    this_01 = FieldDescriptor::default_value_enum(local_18);
    value_00 = EnumValueDescriptor::number(this_01);
    strings::internal::SubstituteArg::SubstituteArg(&local_170,value_00);
    strings::internal::SubstituteArg::SubstituteArg(&local_1a0);
    strings::internal::SubstituteArg::SubstituteArg(&local_1d0);
    strings::internal::SubstituteArg::SubstituteArg(&local_200);
    strings::internal::SubstituteArg::SubstituteArg(&local_230);
    strings::internal::SubstituteArg::SubstituteArg(&local_260);
    strings::internal::SubstituteArg::SubstituteArg(&local_290);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c0);
    strings::internal::SubstituteArg::SubstituteArg(&local_2f0);
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"static_cast< $0 >($1)",(char *)&local_120,
               &local_170,&local_1a0,&local_1d0,&local_200,&local_230,&local_260,&local_290,
               &local_2c0,&local_2f0,in_stack_fffffffffffffb68);
    std::__cxx11::string::~string((string *)&local_140);
    break;
  case CPPTYPE_STRING:
    src = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
    CEscape(&local_350,src);
    EscapeTrigraphs(&local_330,&local_350);
    std::operator+(&local_310,"\"",&local_330);
    std::operator+(__return_storage_ptr__,&local_310,"\"");
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    break;
  case CPPTYPE_MESSAGE:
    FieldMessageTypeName_abi_cxx11_(&local_370,(cxx *)local_18,field_00);
    std::operator+(__return_storage_ptr__,&local_370,"::default_instance()");
    std::__cxx11::string::~string((string *)&local_370);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_3a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cxx25x/cxx_helpers.cc"
               ,0x14d);
    other = internal::LogMessage::operator<<(&local_3a8,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_3a9,other);
    internal::LogMessage::~LogMessage(&local_3a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_3aa);
    std::allocator<char>::~allocator(&local_3aa);
  }
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc rejects the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == kint32min) {
        // Make sure we are in a 2's complement system.
        GOOGLE_COMPILE_ASSERT(kint32min == -0x80000000, kint32min_value_error);
        return "-0x80000000";
      }
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return SimpleItoa(field->default_value_uint32()) + "u";
    case FieldDescriptor::CPPTYPE_INT64:
      // See the comments for CPPTYPE_INT32.
      if (field->default_value_int64() == kint64min) {
        // Make sure we are in a 2's complement system.
        GOOGLE_COMPILE_ASSERT(kint64min == GOOGLE_LONGLONG(-0x8000000000000000),
                       kint64min_value_error);
        return "GOOGLE_LONGLONG(-0x8000000000000000)";
      }
      return "GOOGLE_LONGLONG(" + SimpleItoa(field->default_value_int64()) + ")";
    case FieldDescriptor::CPPTYPE_UINT64:
      return "GOOGLE_ULONGLONG(" + SimpleItoa(field->default_value_uint64())+ ")";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "::google::protobuf::internal::Infinity()";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "-::google::protobuf::internal::Infinity()";
      } else if (value != value) {
        return "::google::protobuf::internal::NaN()";
      } else {
        return SimpleDtoa(value);
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT:
      {
        float value = field->default_value_float();
        if (value == numeric_limits<float>::infinity()) {
          return "static_cast<float>(::google::protobuf::internal::Infinity())";
        } else if (value == -numeric_limits<float>::infinity()) {
          return "static_cast<float>(-::google::protobuf::internal::Infinity())";
        } else if (value != value) {
          return "static_cast<float>(::google::protobuf::internal::NaN())";
        } else {
          string float_value = SimpleFtoa(value);
          // If floating point value contains a period (.) or an exponent
          // (either E or e), then append suffix 'f' to make it a float
          // literal.
          if (float_value.find_first_of(".eE") != string::npos) {
            float_value.push_back('f');
          }
          return float_value;
        }
      }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      // Lazy:  Generate a static_cast because we don't have a helper function
      //   that constructs the full name of an enum value.
      return strings::Substitute(
          "static_cast< $0 >($1)",
          ClassName(field->enum_type(), true),
          field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_STRING:
      return "\"" + EscapeTrigraphs(
        CEscape(field->default_value_string())) +
        "\"";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return FieldMessageTypeName(field) + "::default_instance()";
  }
  // Can't actually get here; make compiler happy.  (We could add a default
  // case above but then we wouldn't get the nice compiler warning when a
  // new type is added.)
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}